

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

Query * q(Query *__return_storage_ptr__,QString *qstr)

{
  Query::Query(__return_storage_ptr__,qstr);
  return __return_storage_ptr__;
}

Assistant:

Query q(QString &&qstr) { return Query(std::move(qstr)); }